

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5PorterCreate(void *pCtx,char **azArg,int nArg,Fts5Tokenizer **ppOut)

{
  int iVar1;
  Fts5Tokenizer *pTok;
  char *pcVar2;
  char **ppcVar3;
  int iVar4;
  void *pUserdata;
  Fts5Tokenizer **local_38;
  
  pUserdata = (void *)0x0;
  if (nArg < 1) {
    pcVar2 = "unicode61";
  }
  else {
    pcVar2 = *azArg;
  }
  local_38 = ppOut;
  pTok = (Fts5Tokenizer *)sqlite3_malloc(0xa0);
  if (pTok == (Fts5Tokenizer *)0x0) {
    iVar1 = 7;
  }
  else {
    iVar4 = 0;
    memset(pTok,0,0xa0);
    iVar1 = (**(code **)((long)pCtx + 0x10))(pCtx,pcVar2,&pUserdata,pTok);
    if (iVar1 == 0) {
      iVar1 = nArg + -1;
      if (nArg < 1) {
        iVar1 = 0;
      }
      ppcVar3 = (char **)0x0;
      if (iVar1 != 0) {
        ppcVar3 = azArg + 1;
      }
      iVar1 = (**(code **)pTok)(pUserdata,ppcVar3,iVar1,pTok + 0x18);
      if (iVar1 == 0) goto LAB_001aee90;
    }
  }
  iVar4 = iVar1;
  fts5PorterDelete(pTok);
  pTok = (Fts5Tokenizer *)0x0;
LAB_001aee90:
  *local_38 = pTok;
  return iVar4;
}

Assistant:

static int fts5PorterCreate(
  void *pCtx, 
  const char **azArg, int nArg,
  Fts5Tokenizer **ppOut
){
  fts5_api *pApi = (fts5_api*)pCtx;
  int rc = SQLITE_OK;
  PorterTokenizer *pRet;
  void *pUserdata = 0;
  const char *zBase = "unicode61";

  if( nArg>0 ){
    zBase = azArg[0];
  }

  pRet = (PorterTokenizer*)sqlite3_malloc(sizeof(PorterTokenizer));
  if( pRet ){
    memset(pRet, 0, sizeof(PorterTokenizer));
    rc = pApi->xFindTokenizer(pApi, zBase, &pUserdata, &pRet->tokenizer);
  }else{
    rc = SQLITE_NOMEM;
  }
  if( rc==SQLITE_OK ){
    int nArg2 = (nArg>0 ? nArg-1 : 0);
    const char **azArg2 = (nArg2 ? &azArg[1] : 0);
    rc = pRet->tokenizer.xCreate(pUserdata, azArg2, nArg2, &pRet->pTokenizer);
  }

  if( rc!=SQLITE_OK ){
    fts5PorterDelete((Fts5Tokenizer*)pRet);
    pRet = 0;
  }
  *ppOut = (Fts5Tokenizer*)pRet;
  return rc;
}